

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

CURLcode tool2curlmime(CURL *curl,tool_mime *m,curl_mime **mime)

{
  curl_mime *pcVar1;
  CURLcode local_24;
  CURLcode ret;
  curl_mime **mime_local;
  tool_mime *m_local;
  CURL *curl_local;
  
  pcVar1 = (curl_mime *)curl_mime_init(curl);
  *mime = pcVar1;
  if (*mime == (curl_mime *)0x0) {
    local_24 = CURLE_OUT_OF_MEMORY;
  }
  else {
    local_24 = tool2curlparts(curl,m->subparts,*mime);
  }
  if (local_24 != CURLE_OK) {
    curl_mime_free(*mime);
    *mime = (curl_mime *)0x0;
  }
  return local_24;
}

Assistant:

CURLcode tool2curlmime(CURL *curl, tool_mime *m, curl_mime **mime)
{
  CURLcode ret = CURLE_OK;

  *mime = curl_mime_init(curl);
  if(!*mime)
    ret = CURLE_OUT_OF_MEMORY;
  else
    ret = tool2curlparts(curl, m->subparts, *mime);
  if(ret) {
    curl_mime_free(*mime);
    *mime = NULL;
  }
  return ret;
}